

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O0

function_return function_call(function_conflict func,void **args,size_t size)

{
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  function_return local_8;
  
  if (in_RDI == 0) {
    log_write_impl_va("metacall",0x23a,"function_call",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_function.c"
                      ,3,"Invalid function call, function pointer is null");
    local_8 = (function_return)0x0;
  }
  else if (in_RSI == 0) {
    log_write_impl_va("metacall",0x241,"function_call",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_function.c"
                      ,3,"Invalid function call, arguments are null");
    local_8 = (function_return)0x0;
  }
  else if (*(long *)(in_RDI + 0x18) == 0) {
    log_write_impl_va("metacall",0x248,"function_call",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_function.c"
                      ,3,"Invalid function call, function interface is null");
    local_8 = (function_return)0x0;
  }
  else if (*(long *)(*(long *)(in_RDI + 0x18) + 8) == 0) {
    log_write_impl_va("metacall",0x24f,"function_call",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_function.c"
                      ,3,"Invalid function call, function interface invoke method is null");
    local_8 = (function_return)0x0;
  }
  else {
    local_8 = (function_return)
              (**(code **)(*(long *)(in_RDI + 0x18) + 8))
                        (in_RDI,*(undefined8 *)(in_RDI + 0x10),in_RSI,in_RDX);
  }
  return local_8;
}

Assistant:

function_return function_call(function func, function_args args, size_t size)
{
	if (func == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid function call, function pointer is null");

		return NULL;
	}

	if (args == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid function call, arguments are null");

		return NULL;
	}

	if (func->interface == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid function call, function interface is null");

		return NULL;
	}

	if (func->interface->invoke == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid function call, function interface invoke method is null");

		return NULL;
	}

	/*
	#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
		return function_call_debug(func, args, size);
	#else
		return func->interface->invoke(func, func->impl, args, size);
	#endif
	*/

	return func->interface->invoke(func, func->impl, args, size);
}